

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O0

void __thiscall llvm::APInt::APInt(APInt *this,APInt *that)

{
  bool bVar1;
  APInt *that_local;
  APInt *this_local;
  
  this->BitWidth = that->BitWidth;
  bVar1 = isSingleWord(this);
  if (bVar1) {
    this->U = that->U;
  }
  else {
    initSlowCase(this,that);
  }
  return;
}

Assistant:

APInt(const APInt &that) : BitWidth(that.BitWidth) {
    if (isSingleWord())
      U.VAL = that.U.VAL;
    else
      initSlowCase(that);
  }